

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_encodeSequences_bmi2
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong *puVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong *puVar18;
  long lVar19;
  uint uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  U16 *u16ptr;
  uint uVar25;
  ulong uVar26;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  
  sVar7 = 0xffffffffffffffba;
  if (8 < dstCapacity) {
    uVar2 = (ushort)*CTable_MatchLength;
    lVar5 = (long)(1 << (uVar2 - 1 & 0x1f));
    if (uVar2 == 0) {
      lVar5 = 1;
    }
    uVar26 = (ulong)mlCodeTable[nbSeq - 1];
    uVar13 = CTable_MatchLength[lVar5 + uVar26 * 2 + 2] + 0x8000;
    local_90 = (ulong)*(ushort *)
                       ((long)CTable_MatchLength +
                       (long)(int)CTable_MatchLength[lVar5 + uVar26 * 2 + 1] * 2 +
                       (ulong)((uVar13 & 0xffff0000) - CTable_MatchLength[lVar5 + uVar26 * 2 + 2] >>
                              ((ulong)(uVar13 >> 0x10) & 0x3f)) * 2 + 4);
    bVar1 = ofCodeTable[nbSeq - 1];
    uVar9 = (ulong)bVar1;
    uVar3 = (ushort)*CTable_OffsetBits;
    lVar6 = (long)(1 << (uVar3 - 1 & 0x1f));
    if (uVar3 == 0) {
      lVar6 = 1;
    }
    uVar13 = CTable_OffsetBits[lVar6 + uVar9 * 2 + 2] + 0x8000;
    uVar4 = (ushort)*CTable_LitLength;
    lVar19 = (long)(1 << (uVar4 - 1 & 0x1f));
    if (uVar4 == 0) {
      lVar19 = 1;
    }
    local_98 = (ulong)*(ushort *)
                       ((long)CTable_OffsetBits +
                       (long)(int)CTable_OffsetBits[lVar6 + uVar9 * 2 + 1] * 2 +
                       (ulong)((uVar13 & 0xffff0000) - CTable_OffsetBits[lVar6 + uVar9 * 2 + 2] >>
                              ((ulong)(uVar13 >> 0x10) & 0x3f)) * 2 + 4);
    uVar22 = (ulong)llCodeTable[nbSeq - 1];
    uVar11 = CTable_LitLength[lVar19 + uVar22 * 2 + 2] + 0x8000;
    uVar13 = LL_bits[uVar22];
    local_a0 = (ulong)*(ushort *)
                       ((long)CTable_LitLength +
                       (long)(int)CTable_LitLength[lVar19 + uVar22 * 2 + 1] * 2 +
                       (ulong)((uVar11 & 0xffff0000) - CTable_LitLength[lVar19 + uVar22 * 2 + 2] >>
                              ((ulong)(uVar11 >> 0x10) & 0x3f)) * 2 + 4);
    uVar22 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar26]]) <<
             ((ulong)uVar13 & 0x3f) |
             (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar13]);
    uVar13 = ML_bits[uVar26] + uVar13;
    uVar26 = (ulong)uVar13;
    puVar21 = (ulong *)((long)dst + (dstCapacity - 8));
    puVar10 = (ulong *)dst;
    if (longOffsets == 0) {
      uVar22 = (ulong)(BIT_mask[uVar9] & sequences[nbSeq - 1].offset) << (uVar26 & 0x3f) | uVar22;
      uVar11 = uVar13 + bVar1;
    }
    else {
      uVar11 = 0x38;
      if (bVar1 < 0x38) {
        uVar11 = (uint)bVar1;
      }
      uVar25 = bVar1 - uVar11;
      if (0x38 < bVar1) {
        uVar22 = (ulong)(BIT_mask[uVar25] & sequences[nbSeq - 1].offset) << (uVar26 & 0x3f) | uVar22
        ;
        uVar13 = uVar13 + uVar25;
        *(ulong *)dst = uVar22;
        puVar10 = (ulong *)((ulong)(uVar13 >> 3) + (long)dst);
        if (puVar21 < puVar10) {
          puVar10 = puVar21;
        }
        uVar22 = uVar22 >> ((ulong)((byte)uVar13 & 0xf8) & 0x3f);
        uVar26 = (ulong)(uVar13 & 7);
      }
      uVar22 = (ulong)(sequences[nbSeq - 1].offset >> (uVar25 & 0x1f) & BIT_mask[uVar11]) <<
               (uVar26 & 0x3f) | uVar22;
      uVar11 = (int)uVar26 + uVar11;
    }
    *puVar10 = uVar22;
    puVar10 = (ulong *)((ulong)(uVar11 >> 3) + (long)puVar10);
    if (puVar21 < puVar10) {
      puVar10 = puVar21;
    }
    uVar22 = uVar22 >> ((ulong)((byte)uVar11 & 0xf8) & 0x3f);
    uVar11 = uVar11 & 7;
    if (1 < nbSeq) {
      uVar26 = nbSeq - 2;
      do {
        uVar9 = (ulong)llCodeTable[uVar26];
        bVar1 = ofCodeTable[uVar26];
        uVar12 = (ulong)bVar1;
        uVar14 = (ulong)mlCodeTable[uVar26];
        uVar23 = CTable_OffsetBits[lVar6 + uVar12 * 2 + 2] + local_98 >> 0x10;
        uVar25 = (uint)local_98;
        uVar13 = uVar11 + (int)(CTable_OffsetBits[lVar6 + uVar12 * 2 + 2] + local_98 >> 0x10);
        local_98 = (ulong)*(ushort *)
                           ((long)CTable_OffsetBits +
                           (long)(int)CTable_OffsetBits[lVar6 + uVar12 * 2 + 1] * 2 +
                           (local_98 >> (uVar23 & 0x3f)) * 2 + 4);
        uVar15 = CTable_MatchLength[lVar5 + uVar14 * 2 + 2] + local_90 >> 0x10;
        uVar20 = (uint)local_90;
        uVar24 = (int)(CTable_MatchLength[lVar5 + uVar14 * 2 + 2] + local_90 >> 0x10) + uVar13;
        local_90 = (ulong)*(ushort *)
                           ((long)CTable_MatchLength +
                           (long)(int)CTable_MatchLength[lVar5 + uVar14 * 2 + 1] * 2 +
                           (local_90 >> (uVar15 & 0x3f)) * 2 + 4);
        uVar16 = CTable_LitLength[lVar19 + uVar9 * 2 + 2] + local_a0 >> 0x10;
        uVar22 = (ulong)(BIT_mask[uVar16] & (uint)local_a0) << ((ulong)uVar24 & 0x3f) |
                 (ulong)(BIT_mask[uVar15] & uVar20) << ((ulong)uVar13 & 0x3f) |
                 (ulong)(BIT_mask[uVar23] & uVar25) << uVar11 | uVar22;
        uVar24 = (int)(CTable_LitLength[lVar19 + uVar9 * 2 + 2] + local_a0 >> 0x10) + uVar24;
        uVar13 = LL_bits[uVar9];
        uVar25 = ML_bits[uVar14];
        local_a0 = (ulong)*(ushort *)
                           ((long)CTable_LitLength +
                           (long)(int)CTable_LitLength[lVar19 + uVar9 * 2 + 1] * 2 +
                           (local_a0 >> (uVar16 & 0x3f)) * 2 + 4);
        uVar11 = uVar13 + bVar1 + uVar25;
        if (0x1e < uVar11) {
          *puVar10 = uVar22;
          puVar17 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar10);
          puVar10 = puVar21;
          if (puVar17 <= puVar21) {
            puVar10 = puVar17;
          }
          uVar22 = uVar22 >> ((ulong)((byte)uVar24 & 0xf8) & 0x3f);
          uVar24 = uVar24 & 7;
        }
        uVar22 = (ulong)((uint)sequences[uVar26].matchLength & BIT_mask[uVar25]) <<
                 ((ulong)(uVar24 + uVar13) & 0x3f) |
                 (ulong)((uint)sequences[uVar26].litLength & BIT_mask[uVar13]) <<
                 ((ulong)uVar24 & 0x3f) | uVar22;
        uVar25 = uVar25 + uVar24 + uVar13;
        if (0x38 < uVar11) {
          *puVar10 = uVar22;
          puVar17 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar10);
          puVar10 = puVar21;
          if (puVar17 <= puVar21) {
            puVar10 = puVar17;
          }
          uVar22 = uVar22 >> ((ulong)((byte)uVar25 & 0xf8) & 0x3f);
          uVar25 = uVar25 & 7;
        }
        uVar9 = (ulong)uVar25;
        if (longOffsets == 0) {
          uVar22 = (ulong)(BIT_mask[uVar12] & sequences[uVar26].offset) << (uVar9 & 0x3f) | uVar22;
          uVar11 = uVar25 + bVar1;
        }
        else {
          uVar11 = (uint)bVar1;
          if (0x37 < bVar1) {
            uVar11 = 0x38;
          }
          uVar13 = bVar1 - uVar11;
          if (0x38 < bVar1) {
            uVar22 = (ulong)(BIT_mask[uVar13] & sequences[uVar26].offset) << (uVar9 & 0x3f) | uVar22
            ;
            uVar25 = uVar25 + uVar13;
            *puVar10 = uVar22;
            puVar17 = (ulong *)((ulong)(uVar25 >> 3) + (long)puVar10);
            puVar10 = puVar21;
            if (puVar17 <= puVar21) {
              puVar10 = puVar17;
            }
            uVar22 = uVar22 >> ((ulong)((byte)uVar25 & 0xf8) & 0x3f);
            uVar9 = (ulong)(uVar25 & 7);
          }
          uVar22 = (ulong)(sequences[uVar26].offset >> (uVar13 & 0x1f) & BIT_mask[uVar11]) <<
                   (uVar9 & 0x3f) | uVar22;
          uVar11 = (int)uVar9 + uVar11;
        }
        *puVar10 = uVar22;
        puVar17 = (ulong *)((ulong)(uVar11 >> 3) + (long)puVar10);
        puVar10 = puVar21;
        if (puVar17 <= puVar21) {
          puVar10 = puVar17;
        }
        uVar22 = uVar22 >> ((ulong)((byte)uVar11 & 0xf8) & 0x3f);
        uVar26 = uVar26 - 1;
        uVar11 = uVar11 & 7;
      } while (uVar26 < nbSeq);
    }
    uVar22 = (ulong)((uint)local_90 & BIT_mask[uVar2]) << uVar11 | uVar22;
    uVar11 = uVar11 + uVar2;
    *puVar10 = uVar22;
    puVar10 = (ulong *)((ulong)(uVar11 >> 3) + (long)puVar10);
    if (puVar21 < puVar10) {
      puVar10 = puVar21;
    }
    uVar26 = (ulong)((uint)local_98 & BIT_mask[uVar3]) << (uVar11 & 7) |
             uVar22 >> ((ulong)((byte)uVar11 & 0xf8) & 0x3f);
    uVar13 = (uVar11 & 7) + (uint)uVar3;
    puVar17 = (ulong *)((ulong)(uVar13 >> 3) + (long)puVar10);
    if (puVar21 < puVar17) {
      puVar17 = puVar21;
    }
    *puVar10 = uVar26;
    uVar26 = (ulong)((uint)local_a0 & BIT_mask[uVar4]) << (uVar13 & 7) |
             uVar26 >> ((ulong)((byte)uVar13 & 0xf8) & 0x3f);
    uVar13 = (uVar13 & 7) + (uint)uVar4;
    puVar10 = (ulong *)((ulong)(uVar13 >> 3) + (long)puVar17);
    if (puVar21 < puVar10) {
      puVar10 = puVar21;
    }
    uVar11 = (uVar13 & 7) + 1;
    puVar18 = (ulong *)((ulong)(uVar11 >> 3) + (long)puVar10);
    if (puVar21 < puVar18) {
      puVar18 = puVar21;
    }
    *puVar17 = uVar26;
    *puVar10 = uVar26 >> ((ulong)((byte)uVar13 & 0xf8) & 0x3f) | 1L << (uVar13 & 7);
    sVar8 = 0;
    if (puVar18 < puVar21) {
      sVar8 = (long)puVar18 - ((long)dst + ((ulong)((uVar11 & 7) == 0) - 1));
    }
    sVar7 = 0xffffffffffffffba;
    if (sVar8 != 0) {
      sVar7 = sVar8;
    }
  }
  return sVar7;
}

Assistant:

size_t
ZSTD_encodeSequences_bmi2(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets)
{
    return ZSTD_encodeSequences_body(dst, dstCapacity,
                                    CTable_MatchLength, mlCodeTable,
                                    CTable_OffsetBits, ofCodeTable,
                                    CTable_LitLength, llCodeTable,
                                    sequences, nbSeq, longOffsets);
}